

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O1

void sfd_listener_accept(void *arg,nng_aio *aio)

{
  nni_mtx *mtx;
  _Bool _Var1;
  
  mtx = (nni_mtx *)((long)arg + 0xb0);
  nni_mtx_lock(mtx);
  _Var1 = nni_aio_start(aio,sfd_cancel_accept,arg);
  if (_Var1) {
    if (*(char *)((long)arg + 0x94) == '\x01') {
      nni_mtx_unlock(mtx);
      nni_aio_finish_error(aio,NNG_ECLOSED);
      return;
    }
    if (*(int *)((long)arg + 0x50) == 0) {
      nni_aio_list_append((nni_list *)((long)arg + 0x98),aio);
    }
    else {
      sfd_start_conn((sfd_listener *)arg,aio);
    }
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
sfd_listener_accept(void *arg, nng_aio *aio)
{
	sfd_listener *l = arg;

	nni_mtx_lock(&l->mtx);
	if (!nni_aio_start(aio, sfd_cancel_accept, l)) {
		nni_mtx_unlock(&l->mtx);
		return;
	}
	if (l->closed) {
		nni_mtx_unlock(&l->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}

	if (l->listen_cnt) {
		sfd_start_conn(l, aio);
	} else {
		nni_aio_list_append(&l->accept_q, aio);
	}
	nni_mtx_unlock(&l->mtx);
}